

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O2

TestOneof2_NestedMessage * __thiscall
proto2_unittest::TestOneof2::release_foo_message(TestOneof2 *this)

{
  TestOneof2_NestedMessage *message;
  ulong uVar1;
  
  if ((this->field_0)._impl_._oneof_case_[0] == 7) {
    (this->field_0)._impl_._oneof_case_[0] = 0;
    uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if ((uVar1 & 1) != 0) {
      uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
    }
    message = (TestOneof2_NestedMessage *)(this->field_0)._impl_.foo_.foo_message_;
    if (uVar1 != 0) {
      message = (TestOneof2_NestedMessage *)
                google::protobuf::internal::DuplicateIfNonNullInternal((MessageLite *)message);
    }
    (this->field_0)._impl_.foo_.foo_message_ = (Message *)0x0;
    return message;
  }
  return (TestOneof2_NestedMessage *)0x0;
}

Assistant:

inline ::proto2_unittest::TestOneof2_NestedMessage* PROTOBUF_NULLABLE TestOneof2::release_foo_message() {
  // @@protoc_insertion_point(field_release:proto2_unittest.TestOneof2.foo_message)
  if (foo_case() == kFooMessage) {
    clear_has_foo();
    auto* temp = reinterpret_cast<::proto2_unittest::TestOneof2_NestedMessage*>(_impl_.foo_.foo_message_);
    if (GetArena() != nullptr) {
      temp = ::google::protobuf::internal::DuplicateIfNonNull(temp);
    }
    _impl_.foo_.foo_message_ = nullptr;
    return temp;
  } else {
    return nullptr;
  }
}